

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::translateLogicBinary(Builder *this,BinaryExpr *node)

{
  bool bVar1;
  FunctionModule *this_00;
  BuilderContext *hint;
  size_type sVar2;
  element_type *peVar3;
  BBLIter BVar4;
  BBLIter BVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  const_iterator bb;
  BuilderContext *pBVar7;
  shared_ptr<mocker::ir::Reg> boolExpAddr;
  shared_ptr<mocker::ir::Jump> jumpSucc;
  shared_ptr<mocker::ir::Reg> val;
  shared_ptr<mocker::ir::Label> succLabel;
  shared_ptr<mocker::ir::Label> originLabel;
  Defer undo;
  undefined1 local_1a8 [16];
  code *local_198;
  code *local_190;
  int local_180 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined4 local_16c;
  undefined1 local_168 [48];
  __shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> local_138;
  undefined1 local_128 [16];
  Builder local_118;
  shared_ptr<mocker::ir::IRInst> local_108;
  shared_ptr<mocker::ir::IRInst> local_f8;
  shared_ptr<mocker::ir::IRInst> local_e8;
  _List_node_base *local_d8;
  _List_node_base *local_d0;
  __shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Builder local_98;
  _Any_data local_88;
  _Elt_pointer local_78;
  _Elt_pointer psStack_70;
  shared_ptr<mocker::ir::IRInst> local_68;
  _Any_data local_50;
  _Elt_pointer local_40;
  _Map_pointer ppsStack_38;
  
  if ((this->ctx->logicalExprInfo).inCondition == false) {
    translateEscapedLogicBinary(this,node);
    return;
  }
  bb._M_node = (_List_node_base *)node;
  BVar4 = BuilderContext::getCurBasicBlock(this->ctx);
  getBBLabel(&local_98,bb);
  this_00 = this->ctx->curFunc;
  BVar5 = FunctionModule::pushBackBB(this_00);
  hint = this->ctx;
  local_78 = (_Elt_pointer)0x0;
  psStack_70 = (_Elt_pointer)0x0;
  local_88._M_unused._M_object = (_Map_pointer)0x0;
  local_88._8_8_ = (_Elt_pointer)0x0;
  pBVar7 = hint;
  if (((hint->logicalExprInfo).empty == true) &&
     ((hint->logicalExprInfo).empty = false, (hint->logicalExprInfo).inCondition == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"boolExpAddr",(allocator<char> *)&local_118);
    local_d0 = BVar5._M_node;
    BuilderContext::makeTempLocalReg((BuilderContext *)local_168,(string *)hint);
    local_d8 = BVar4._M_node;
    std::__cxx11::string::~string((string *)local_1a8);
    pBVar7 = this->ctx;
    BVar5._M_node =
         (this_00->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    local_168._16_8_ = this_00;
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
              ((shared_ptr<mocker::ir::Reg> *)local_1a8);
    local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a8._0_8_;
    local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
    local_1a8._0_8_ = (element_type *)0x0;
    local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar7,BVar5,&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    BVar4 = FunctionModule::pushBackBB((FunctionModule *)local_168._16_8_);
    getBBLabel(&local_118,(const_iterator)BVar5._M_node);
    pBVar7 = this->ctx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"v",(allocator<char> *)(local_168 + 0x30));
    local_168._40_8_ = BVar4;
    BuilderContext::makeTempLocalReg((BuilderContext *)local_128,(string *)pBVar7);
    std::__cxx11::string::~string((string *)local_1a8);
    pBVar7 = this->ctx;
    std::
    make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((shared_ptr<mocker::ir::Reg> *)local_1a8,(shared_ptr<mocker::ir::Reg> *)local_128);
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a8._0_8_;
    local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
    local_1a8._0_8_ = (element_type *)0x0;
    local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar7,(BBLIter)local_168._40_8_,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    pBVar7 = this->ctx;
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              (local_a8,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    BuilderContext::setExprAddr(pBVar7,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
              ((shared_ptr<mocker::ir::Label> *)(local_168 + 0x30));
    BVar5 = FunctionModule::pushBackBB((FunctionModule *)local_168._16_8_);
    (hint->logicalExprInfo).trueNext._M_node = BVar5._M_node;
    pBVar7 = this->ctx;
    local_16c = 1;
    std::make_shared<mocker::ir::IntLiteral,int>(local_180);
    std::
    make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((shared_ptr<mocker::ir::Reg> *)local_1a8,
               (shared_ptr<mocker::ir::IntLiteral> *)local_168);
    local_f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a8._0_8_;
    local_f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
    local_1a8._0_8_ = (element_type *)0x0;
    local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar7,BVar5,&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
    pBVar7 = this->ctx;
    BVar5._M_node = (hint->logicalExprInfo).trueNext._M_node;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              (local_b8,(__shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> *)
                        (local_168 + 0x30));
    BuilderContext::appendInst(pBVar7,BVar5,(shared_ptr<mocker::ir::IRInst> *)local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
    BVar5 = FunctionModule::pushBackBB((FunctionModule *)local_168._16_8_);
    *(_List_node_base **)&(hint->logicalExprInfo).falseNext = BVar5._M_node;
    pBVar7 = this->ctx;
    local_16c = 0;
    std::make_shared<mocker::ir::IntLiteral,int>(local_180);
    std::
    make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
              ((shared_ptr<mocker::ir::Reg> *)local_1a8,
               (shared_ptr<mocker::ir::IntLiteral> *)local_168);
    local_108.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a8._0_8_;
    local_108.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
    local_1a8._0_8_ = (element_type *)0x0;
    local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInst(pBVar7,BVar5,&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
    pBVar7 = this->ctx;
    BVar5._M_node =
         (_List_node_base *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              (local_c8,(__shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> *)
                        (local_168 + 0x30));
    BuilderContext::appendInst(pBVar7,BVar5,(shared_ptr<mocker::ir::IRInst> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
    local_50._8_8_ = local_168._40_8_;
    local_190 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
                ::_M_invoke;
    local_1a8._8_8_ = local_168._40_8_;
    local_198 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:592:18)>
                ::_M_manager;
    local_40 = (_Elt_pointer)0x0;
    ppsStack_38 = (_Map_pointer)0x0;
    local_1a8._0_8_ = this;
    local_50._M_unused._M_object = this;
    Defer::operator=((Defer *)&local_88,(Defer *)local_1a8);
    Defer::~Defer((Defer *)local_1a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118.ctx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
    pBVar7 = this->ctx;
    BVar5._M_node = local_d0;
    BVar4._M_node = local_d8;
  }
  BuilderContext::setCurBasicBlock(pBVar7,BVar4);
  local_168._16_8_ = *(undefined8 *)&hint->logicalExprInfo;
  local_168._24_4_ = *(undefined4 *)&(hint->logicalExprInfo).trueNext._M_node;
  local_168._28_4_ = *(undefined4 *)((long)&(hint->logicalExprInfo).trueNext._M_node + 4);
  sVar2 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity;
  bVar1 = (hint->logicalExprInfo).inCondition;
  if (node->op == LogicalOr) {
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(hint->logicalExprInfo).falseNext;
  }
  else {
    if (node->op != LogicalAnd) goto LAB_0013849e;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(hint->logicalExprInfo).trueNext;
  }
  *(_List_node_base **)paVar6 = BVar5._M_node;
LAB_0013849e:
  peVar3 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
            (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  *(undefined8 *)&hint->logicalExprInfo = local_168._16_8_;
  (hint->logicalExprInfo).trueNext._M_node =
       (_List_node_base *)CONCAT44(local_168._28_4_,local_168._24_4_);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&(hint->logicalExprInfo).falseNext)->_M_allocated_capacity = sVar2;
  (hint->logicalExprInfo).inCondition = bVar1;
  BuilderContext::setCurBasicBlock(this->ctx,BVar5);
  peVar3 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
            (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  Defer::~Defer((Defer *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.ctx);
  return;
}

Assistant:

void Builder::translateLogicBinary(const ast::BinaryExpr &node) const {
  if (!ctx.getLogicalExprInfo().inCondition) {
    translateEscapedLogicBinary(node);
    return;
  }

  auto originBB = ctx.getCurBasicBlock();
  auto originLabel = getBBLabel(originBB);
  FunctionModule &func = ctx.getCurFunc();
  auto lhsFirstBB = originBB;
  auto rhsFirstBB = func.pushBackBB();
  auto &info = ctx.getLogicalExprInfo();

  Defer undo;
  while (info.empty) {
    info.empty = false;

    if (info.inCondition)
      break;

    auto boolExpAddr = ctx.makeTempLocalReg("boolExpAddr");
    ctx.appendInstFront(func.getFirstBB(),
                        std::make_shared<Alloca>(boolExpAddr));

    auto succBB = func.pushBackBB();
    auto succLabel = getBBLabel(succBB);
    auto val = ctx.makeTempLocalReg("v");
    ctx.appendInst(succBB, std::make_shared<Load>(val, boolExpAddr));
    ctx.setExprAddr(node.getID(), val);

    auto jumpSucc = std::make_shared<Jump>(succLabel);
    info.trueNext = func.pushBackBB();
    ctx.appendInst(
        info.trueNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(1)));
    ctx.appendInst(info.trueNext, jumpSucc);
    info.falseNext = func.pushBackBB();
    ctx.appendInst(
        info.falseNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(0)));
    ctx.appendInst(info.falseNext, jumpSucc);

    undo = Defer([this, succBB] {
      ctx.getLogicalExprInfo().empty = true;
      ctx.setCurBasicBlock(succBB);
    });

    break;
  }

  ctx.setCurBasicBlock(lhsFirstBB);
  auto infoBak = info;
  if (node.op == ast::BinaryExpr::LogicalOr) {
    info.trueNext = infoBak.trueNext;
    info.falseNext = rhsFirstBB;
  } else if (node.op == ast::BinaryExpr::LogicalAnd) {
    info.trueNext = rhsFirstBB;
    info.falseNext = infoBak.falseNext;
  }
  visit(*node.lhs);
  info = infoBak;

  ctx.setCurBasicBlock(rhsFirstBB);
  visit(*node.rhs);
}